

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

int aom_denoise_and_model_run
              (aom_denoise_and_model_t *ctx,YV12_BUFFER_CONFIG *sd,aom_film_grain_t *film_grain,
              int apply_denoise)

{
  uint8_t **denoised;
  aom_noise_model_t *noise_model;
  int stride;
  int iVar1;
  aom_noise_status_t aVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint8_t *__dest;
  uint8_t *puVar6;
  sbyte sVar7;
  int h;
  uint8_t *__dest_00;
  uint8_t *data_00;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint use_highbd;
  ulong uVar12;
  float fVar13;
  float fVar14;
  aom_noise_model_params_t params;
  size_t sVar15;
  int strides [3];
  undefined8 local_50;
  uint8_t *data [3];
  
  uVar11 = sd->flags;
  data_00 = (sd->field_5).field_0.y_buffer;
  uVar9 = uVar11 & 8;
  if (uVar9 == 0) {
    __dest = (sd->field_5).field_0.u_buffer;
    __dest_00 = (sd->field_5).field_0.v_buffer;
  }
  else {
    data_00 = (uint8_t *)((long)data_00 * 2);
    __dest = (uint8_t *)((long)(sd->field_5).field_0.u_buffer * 2);
    __dest_00 = (uint8_t *)((long)(sd->field_5).field_0.v_buffer * 2);
  }
  iVar5 = ctx->block_size;
  stride = (sd->field_4).field_0.y_stride;
  iVar1 = (sd->field_4).field_0.uv_stride;
  local_50._0_4_ = sd->subsampling_x;
  local_50._4_4_ = sd->subsampling_y;
  iVar4 = ctx->width;
  iVar3 = (sd->field_0).field_0.y_width;
  strides[0] = stride;
  strides[1] = iVar1;
  strides[2] = iVar1;
  data[0] = data_00;
  data[1] = __dest;
  data[2] = __dest_00;
  if ((((iVar4 != iVar3) || (h = ctx->height, h != (sd->field_1).field_0.y_height)) ||
      (ctx->y_stride != stride)) || (ctx->uv_stride != iVar1)) {
    ctx->width = iVar3;
    ctx->height = (sd->field_1).field_0.y_height;
    ctx->y_stride = (sd->field_4).field_0.y_stride;
    ctx->uv_stride = (sd->field_4).field_0.uv_stride;
    for (lVar10 = 8; lVar10 != 0xb; lVar10 = lVar10 + 1) {
      aom_free(ctx->noise_psd[lVar10 + -5]);
      ctx->noise_psd[lVar10 + -5] = (float *)0x0;
    }
    uVar11 = uVar11 >> 3;
    use_highbd = uVar11 & 1;
    aom_free(ctx->flat_blocks);
    ctx->flat_blocks = (uint8_t *)0x0;
    sVar7 = (sbyte)use_highbd;
    puVar6 = (uint8_t *)
             aom_malloc((long)((sd->field_1).field_0.y_height * (sd->field_4).field_0.y_stride <<
                              sVar7));
    ctx->denoised[0] = puVar6;
    puVar6 = (uint8_t *)
             aom_malloc((long)((sd->field_1).field_0.uv_height * (sd->field_4).field_0.uv_stride <<
                              sVar7));
    ctx->denoised[1] = puVar6;
    puVar6 = (uint8_t *)
             aom_malloc((long)((sd->field_1).field_0.uv_height * (sd->field_4).field_0.uv_stride <<
                              sVar7));
    ctx->denoised[2] = puVar6;
    if (((ctx->denoised[0] == (uint8_t *)0x0) || (ctx->denoised[1] == (uint8_t *)0x0)) ||
       (puVar6 == (uint8_t *)0x0)) {
      pcVar8 = "Unable to allocate denoise buffers\n";
      sVar15 = 0x23;
    }
    else {
      iVar4 = ctx->block_size;
      iVar3 = ((sd->field_0).field_0.y_width + iVar4 + -1) / iVar4;
      ctx->num_blocks_w = iVar3;
      iVar4 = (iVar4 + -1 + (sd->field_1).field_0.y_height) / iVar4;
      ctx->num_blocks_h = iVar4;
      puVar6 = (uint8_t *)aom_malloc((long)(iVar4 * iVar3));
      ctx->flat_blocks = puVar6;
      if (puVar6 == (uint8_t *)0x0) {
        pcVar8 = "Unable to allocate flat_blocks buffer\n";
        sVar15 = 0x26;
      }
      else {
        aom_flat_block_finder_free(&ctx->flat_block_finder);
        iVar4 = aom_flat_block_finder_init
                          (&ctx->flat_block_finder,ctx->block_size,ctx->bit_depth,use_highbd);
        if (iVar4 == 0) {
          pcVar8 = "Unable to init flat block finder\n";
          sVar15 = 0x21;
        }
        else {
          uVar12 = CONCAT44(uVar11,ctx->bit_depth) & 0x1ffffffff;
          aom_noise_model_free(&ctx->noise_model);
          params.bit_depth = (int)uVar12;
          params.use_highbd = (int)(uVar12 >> 0x20);
          params.shape = '\x01';
          params._1_3_ = 0;
          params.lag = 3;
          iVar4 = aom_noise_model_init(&ctx->noise_model,params);
          if (iVar4 != 0) {
            fVar13 = aom_noise_psd_get_default_value(ctx->block_size,ctx->noise_level);
            fVar14 = aom_noise_psd_get_default_value
                               (ctx->block_size >> ((byte)sd->subsampling_x & 0x1f),ctx->noise_level
                               );
            for (uVar12 = 0; (uint)(iVar5 * iVar5) != uVar12; uVar12 = uVar12 + 1) {
              ctx->noise_psd[0][uVar12] = fVar13;
              ctx->noise_psd[2][uVar12] = fVar14;
              ctx->noise_psd[1][uVar12] = fVar14;
            }
            iVar4 = (sd->field_0).field_0.y_width;
            h = (sd->field_1).field_0.y_height;
            goto LAB_002591e0;
          }
          pcVar8 = "Unable to init noise model\n";
          sVar15 = 0x1b;
        }
      }
    }
    fwrite(pcVar8,sVar15,1,_stderr);
    pcVar8 = "Unable to realloc buffers\n";
    sVar15 = 0x1a;
    goto LAB_002593c6;
  }
LAB_002591e0:
  uVar9 = uVar9 >> 3;
  aom_flat_block_finder_run(&ctx->flat_block_finder,data_00,iVar4,h,stride,ctx->flat_blocks);
  denoised = ctx->denoised;
  iVar4 = aom_wiener_denoise_2d
                    (data,denoised,(sd->field_0).field_0.y_width,(sd->field_1).field_0.y_height,
                     strides,(int *)&local_50,ctx->noise_psd,iVar5,ctx->bit_depth,uVar9);
  if (iVar4 == 0) {
    pcVar8 = "Unable to denoise image\n";
    sVar15 = 0x18;
    goto LAB_002593c6;
  }
  noise_model = &ctx->noise_model;
  aVar2 = aom_noise_model_update
                    (noise_model,data,denoised,(sd->field_0).field_0.y_width,
                     (sd->field_1).field_0.y_height,strides,(int *)&local_50,ctx->flat_blocks,iVar5)
  ;
  if (aVar2 == '\0') {
LAB_00259285:
    film_grain->apply_grain = 0;
  }
  else {
    if (aVar2 == '\x03') {
      aom_noise_model_save_latest(noise_model);
      goto LAB_00259285;
    }
    iVar5 = (ctx->noise_model).combined_state[0].strength_solver.num_equations;
    film_grain->apply_grain = 0;
    if (iVar5 < 1) {
      return 1;
    }
  }
  iVar5 = aom_noise_model_get_grain_parameters(noise_model,film_grain);
  if (iVar5 != 0) {
    if (film_grain->random_seed == 0) {
      film_grain->random_seed = 0x1cdf;
    }
    if (apply_denoise == 0) {
      return 1;
    }
    sVar7 = (sbyte)uVar9;
    memcpy(data_00,*denoised,(long)(stride * (sd->field_1).field_0.y_height << sVar7));
    if (sd->monochrome != '\0') {
      return 1;
    }
    memcpy(__dest,ctx->denoised[1],(long)((sd->field_1).field_0.uv_height * iVar1 << sVar7));
    memcpy(__dest_00,ctx->denoised[2],(long)(iVar1 * (sd->field_1).field_0.uv_height << sVar7));
    return 1;
  }
  pcVar8 = "Unable to get grain parameters.\n";
  sVar15 = 0x20;
LAB_002593c6:
  fwrite(pcVar8,sVar15,1,_stderr);
  return 0;
}

Assistant:

int aom_denoise_and_model_run(struct aom_denoise_and_model_t *ctx,
                              const YV12_BUFFER_CONFIG *sd,
                              aom_film_grain_t *film_grain, int apply_denoise) {
  const int block_size = ctx->block_size;
  const int use_highbd = (sd->flags & YV12_FLAG_HIGHBITDEPTH) != 0;
  uint8_t *raw_data[3] = {
    use_highbd ? (uint8_t *)CONVERT_TO_SHORTPTR(sd->y_buffer) : sd->y_buffer,
    use_highbd ? (uint8_t *)CONVERT_TO_SHORTPTR(sd->u_buffer) : sd->u_buffer,
    use_highbd ? (uint8_t *)CONVERT_TO_SHORTPTR(sd->v_buffer) : sd->v_buffer,
  };
  const uint8_t *const data[3] = { raw_data[0], raw_data[1], raw_data[2] };
  int strides[3] = { sd->y_stride, sd->uv_stride, sd->uv_stride };
  int chroma_sub_log2[2] = { sd->subsampling_x, sd->subsampling_y };

  if (!denoise_and_model_realloc_if_necessary(ctx, sd)) {
    fprintf(stderr, "Unable to realloc buffers\n");
    return 0;
  }

  aom_flat_block_finder_run(&ctx->flat_block_finder, data[0], sd->y_width,
                            sd->y_height, strides[0], ctx->flat_blocks);

  if (!aom_wiener_denoise_2d(data, ctx->denoised, sd->y_width, sd->y_height,
                             strides, chroma_sub_log2, ctx->noise_psd,
                             block_size, ctx->bit_depth, use_highbd)) {
    fprintf(stderr, "Unable to denoise image\n");
    return 0;
  }

  const aom_noise_status_t status = aom_noise_model_update(
      &ctx->noise_model, data, (const uint8_t *const *)ctx->denoised,
      sd->y_width, sd->y_height, strides, chroma_sub_log2, ctx->flat_blocks,
      block_size);
  int have_noise_estimate = 0;
  if (status == AOM_NOISE_STATUS_OK) {
    have_noise_estimate = 1;
  } else if (status == AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE) {
    aom_noise_model_save_latest(&ctx->noise_model);
    have_noise_estimate = 1;
  } else {
    // Unable to update noise model; proceed if we have a previous estimate.
    have_noise_estimate =
        (ctx->noise_model.combined_state[0].strength_solver.num_equations > 0);
  }

  film_grain->apply_grain = 0;
  if (have_noise_estimate) {
    if (!aom_noise_model_get_grain_parameters(&ctx->noise_model, film_grain)) {
      fprintf(stderr, "Unable to get grain parameters.\n");
      return 0;
    }
    if (!film_grain->random_seed) {
      film_grain->random_seed = 7391;
    }
    if (apply_denoise) {
      memcpy(raw_data[0], ctx->denoised[0],
             (strides[0] * sd->y_height) << use_highbd);
      if (!sd->monochrome) {
        memcpy(raw_data[1], ctx->denoised[1],
               (strides[1] * sd->uv_height) << use_highbd);
        memcpy(raw_data[2], ctx->denoised[2],
               (strides[2] * sd->uv_height) << use_highbd);
      }
    }
  }
  return 1;
}